

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push.c
# Opt level: O2

void push0_send_cb(void *arg)

{
  nni_aio *aio;
  nng_err nVar1;
  nni_msg *m;
  
  aio = (nni_aio *)((long)arg + 0x1e8);
  nVar1 = nni_aio_result(aio);
  if (nVar1 != NNG_OK) {
    m = nni_aio_get_msg(aio);
    nni_msg_free(m);
    nni_aio_set_msg(aio,(nni_msg *)0x0);
    nni_pipe_close(*arg);
    return;
  }
  push0_pipe_ready((push0_pipe *)arg);
  return;
}

Assistant:

static void
push0_send_cb(void *arg)
{
	push0_pipe *p = arg;

	if (nni_aio_result(&p->aio_send) != 0) {
		nni_msg_free(nni_aio_get_msg(&p->aio_send));
		nni_aio_set_msg(&p->aio_send, NULL);
		nni_pipe_close(p->pipe);
		return;
	}

	push0_pipe_ready(p);
}